

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<unsigned_long_long>::Matcher
          (Matcher<unsigned_long_long> *this,unsigned_long_long value)

{
  MatcherBase<unsigned_long_long> local_30;
  unsigned_long_long local_18;
  
  (this->super_MatcherBase<unsigned_long_long>).impl_.value_ =
       (MatcherInterface<unsigned_long_long> *)0x0;
  (this->super_MatcherBase<unsigned_long_long>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_long_long>).impl_.link_;
  (this->super_MatcherBase<unsigned_long_long>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b8dd8;
  local_18 = value;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<unsigned_long_long> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_long_long>_>::operator=
            (&(this->super_MatcherBase<unsigned_long_long>).impl_,&local_30.impl_);
  internal::MatcherBase<unsigned_long_long>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }